

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O3

BOOL __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::ReassignPages
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,Recycler *recycler)

{
  size_t *psVar1;
  HeapBlockType HVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  BOOL BVar6;
  PageSegment *in_RAX;
  undefined4 *puVar7;
  IdleDecommitPageAllocator *pIVar8;
  char *baseAddress;
  PageSegment *local_28;
  PageSegment *segment;
  
  local_28 = in_RAX;
  if ((this->super_HeapBlock).address != (char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x13b,"(this->address == nullptr)","this->address == nullptr");
    if (!bVar4) goto LAB_006ad95e;
    *puVar7 = 0;
  }
  if ((this->super_HeapBlock).segment != (Segment *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x13c,"(this->segment == nullptr)","this->segment == nullptr");
    if (!bVar4) {
LAB_006ad95e:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  pIVar8 = GetPageAllocator(this);
  baseAddress = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                ::AllocPagesPageAligned(&pIVar8->super_PageAllocator,8,&local_28);
  BVar5 = 0;
  if (baseAddress != (char *)0x0) {
    psVar1 = &(recycler->autoHeap).uncollectedNewPageCount;
    *psVar1 = *psVar1 + 8;
    HVar2 = (this->super_HeapBlock).heapBlockType;
    if ((HVar2 != SmallLeafBlockType) && (HVar2 != MediumLeafBlockType)) {
      Recycler::VerifyZeroFill(recycler,baseAddress,0x8000);
    }
    BVar6 = SetPage(this,baseAddress,local_28,recycler);
    BVar5 = 1;
    if (BVar6 == 0) {
      pIVar8 = GetPageAllocator(this);
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::SuspendIdleDecommit(&pIVar8->super_PageAllocator);
      ReleasePages(this,recycler);
      pIVar8 = GetPageAllocator(this);
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::ResumeIdleDecommit(&pIVar8->super_PageAllocator);
      BVar5 = 0;
    }
  }
  return BVar5;
}

Assistant:

BOOL
SmallHeapBlockT<TBlockAttributes>::ReassignPages(Recycler * recycler)
{
    Assert(this->address == nullptr);
    Assert(this->segment == nullptr);

    PageSegment * segment;

    auto pageAllocator = this->GetPageAllocator();
    uint pagecount = this->GetPageCount();
    char * address = pageAllocator->AllocPagesPageAligned(pagecount, &segment);

    if (address == NULL)
    {
        return FALSE;
    }

#if ENABLE_PARTIAL_GC
    recycler->autoHeap.uncollectedNewPageCount += this->GetPageCount();
#endif
#ifdef RECYCLER_ZERO_MEM_CHECK
    if (!this->IsLeafBlock()
#ifdef RECYCLER_WRITE_BARRIER_ALLOC_THREAD_PAGE
        && !this->IsWithBarrier()
#endif
        )
    {
        recycler->VerifyZeroFill(address, AutoSystemInfo::PageSize * this->GetPageCount());
    }
#endif

    if (!this->SetPage(address, segment, recycler))
    {
        this->GetPageAllocator()->SuspendIdleDecommit();
        this->ReleasePages(recycler);
        this->GetPageAllocator()->ResumeIdleDecommit();
        return FALSE;
    }

    RECYCLER_PERF_COUNTER_ADD(FreeObjectSize, this->GetPageCount() * AutoSystemInfo::PageSize);
    RECYCLER_PERF_COUNTER_ADD(SmallHeapBlockFreeObjectSize, this->GetPageCount() * AutoSystemInfo::PageSize);
    return TRUE;
}